

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry_&> __thiscall
kj::
Table<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>>
::find<0ul,capnp::StructSchema&>
          (Table<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>>
           *this,StructSchema *params)

{
  RawBrandedSchema *pRVar1;
  RawSchema **ppRVar2;
  ArrayPtr<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table;
  HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> local_28 [8];
  long local_20;
  
  table.ptr = (Entry *)(params + 4);
  pRVar1 = (params->super_Schema).raw;
  table.size_ = (size_t)pRVar1;
  HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
  find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry_const,capnp::StructSchema&>
            (local_28,table,
             (StructSchema *)(((long)params[1].super_Schema.raw - (long)pRVar1) / 0x18));
  if (local_28[0] ==
      (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x1) {
    ppRVar2 = &((params->super_Schema).raw)->generic + local_20 * 3;
  }
  else {
    ppRVar2 = (RawSchema **)0x0;
  }
  *(RawSchema ***)this = ppRVar2;
  return (Maybe<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry_&>)
         (Entry *)this;
}

Assistant:

kj::Maybe<const Row&> Table<Row, Indexes...>::find(Params&&... params) const {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}